

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O0

bool spvtools::utils::operator==
               (SmallVector<unsigned_int,_2UL> *lhs,SmallVector<unsigned_int,_2UL> *rhs)

{
  size_t sVar1;
  size_t sVar2;
  const_iterator puVar3;
  const_iterator local_30;
  const_iterator lit;
  const_iterator rit;
  SmallVector<unsigned_int,_2UL> *rhs_local;
  SmallVector<unsigned_int,_2UL> *lhs_local;
  
  sVar1 = SmallVector<unsigned_int,_2UL>::size(lhs);
  sVar2 = SmallVector<unsigned_int,_2UL>::size(rhs);
  if (sVar1 == sVar2) {
    lit = SmallVector<unsigned_int,_2UL>::begin(rhs);
    for (local_30 = SmallVector<unsigned_int,_2UL>::begin(lhs);
        puVar3 = SmallVector<unsigned_int,_2UL>::end(lhs), local_30 != puVar3;
        local_30 = local_30 + 1) {
      if (*local_30 != *lit) {
        return false;
      }
      lit = lit + 1;
    }
    lhs_local._7_1_ = true;
  }
  else {
    lhs_local._7_1_ = false;
  }
  return lhs_local._7_1_;
}

Assistant:

bool operator==(const SmallVector& lhs, const OtherVector& rhs) {
    if (lhs.size() != rhs.size()) {
      return false;
    }

    auto rit = rhs.begin();
    for (auto lit = lhs.begin(); lit != lhs.end(); ++lit, ++rit) {
      if (*lit != *rit) {
        return false;
      }
    }
    return true;
  }